

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PointerPrinter::
     PrintValue<google::protobuf::internal::TcParseTable<0ul,6ul,0ul,0ul,8ul>>
               (TcParseTable<0UL,_6UL,_0UL,_0UL,_8UL> *p,ostream *os)

{
  ostream *os_local;
  TcParseTable<0UL,_6UL,_0UL,_0UL,_8UL> *p_local;
  
  if (p == (TcParseTable<0UL,_6UL,_0UL,_0UL,_8UL> *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::ostream::operator<<(os,p);
  }
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    }
  }